

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreqTable.cpp
# Opt level: O0

void __thiscall FreqTable::initCum(FreqTable *this)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *in_RDI;
  double *freq;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  double sum;
  vector<double,_std::allocator<double>_> cumul;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff88;
  value_type_conflict2 *__x;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_50;
  size_type in_stack_ffffffffffffffb8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffc0;
  value_type_conflict2 local_20 [4];
  
  __x = local_20;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x15f3e2);
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<double,_std::allocator<double>_>::push_back
            (in_RDI,(value_type_conflict2 *)in_stack_ffffffffffffff88);
  local_50._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff88);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<double_*,_std::vector<double,_std::allocator<double>_>_>
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_RDI,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)in_stack_ffffffffffffff88);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffa0 =
         (vector<double,_std::allocator<double>_> *)
         __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
         operator*(&local_50);
    std::vector<double,_std::allocator<double>_>::push_back(in_stack_ffffffffffffffa0,__x);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_50);
  }
  std::vector<double,_std::allocator<double>_>::operator=
            (__range1,(vector<double,_std::allocator<double>_> *)__begin1._M_current);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void FreqTable::initCum() {
    vector<double> cumul;
    cumul.reserve(257);
    double sum = 0;
    cumul.push_back(0);
    for (const auto &freq : frequencies) {
        sum += freq;
        cumul.push_back(sum);
    }
    cumulative = cumul;
}